

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_153ab3::FunctionEncoding::printLeft(FunctionEncoding *this,OutputStream *S)

{
  bool bVar1;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  FunctionEncoding *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  if (this->Ret != (Node *)0x0) {
    (*this->Ret->_vptr_Node[4])(this->Ret,S);
    bVar1 = Node::hasRHSComponent(this->Ret,local_18);
    if (!bVar1) {
      StringView::StringView(&local_28," ");
      OutputStream::operator+=(local_18,local_28);
    }
  }
  Node::print(this->Name,local_18);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (Ret) {
      Ret->printLeft(S);
      if (!Ret->hasRHSComponent(S))
        S += " ";
    }
    Name->print(S);
  }